

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O1

void __thiscall cmOrderDirectories::VisitDirectory(cmOrderDirectories *this,uint i)

{
  int iVar1;
  pointer piVar2;
  pointer pCVar3;
  pointer ppVar4;
  ConflictPair *j;
  pointer ppVar5;
  
  piVar2 = (this->DirectoryVisited).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = piVar2[i];
  if (iVar1 == 0) {
    piVar2[i] = this->WalkId;
    pCVar3 = (this->ConflictGraph).
             super__Vector_base<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar4 = *(pointer *)
              ((long)&pCVar3[i].
                      super_vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl + 8);
    for (ppVar5 = *(pointer *)
                   &pCVar3[i].
                    super_vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl; ppVar5 != ppVar4; ppVar5 = ppVar5 + 1) {
      VisitDirectory(this,ppVar5->first);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->OrderedDirectories,
                (this->OriginalDirectories).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + i);
    return;
  }
  if (iVar1 == this->WalkId) {
    DiagnoseCycle(this);
    return;
  }
  return;
}

Assistant:

void cmOrderDirectories::VisitDirectory(unsigned int i)
{
  // Skip nodes already visited.
  if (this->DirectoryVisited[i]) {
    if (this->DirectoryVisited[i] == this->WalkId) {
      // We have reached a node previously visited on this DFS.
      // There is a cycle.
      this->DiagnoseCycle();
    }
    return;
  }

  // We are now visiting this node so mark it.
  this->DirectoryVisited[i] = this->WalkId;

  // Visit the neighbors of the node first.
  ConflictList const& clist = this->ConflictGraph[i];
  for (ConflictPair const& j : clist) {
    this->VisitDirectory(j.first);
  }

  // Now that all directories required to come before this one have
  // been emmitted, emit this directory.
  this->OrderedDirectories.push_back(this->OriginalDirectories[i]);
}